

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msvc_objectmodel.cpp
# Opt level: O0

void __thiscall VCLinkerTool::VCLinkerTool(VCLinkerTool *this)

{
  VCToolBase *in_RDI;
  
  VCToolBase::VCToolBase(in_RDI);
  in_RDI->_vptr_VCToolBase = (_func_int **)&PTR__VCLinkerTool_003bab30;
  QList<QString>::QList((QList<QString> *)0x26e968);
  QList<QString>::QList((QList<QString> *)0x26e976);
  QList<QString>::QList((QList<QString> *)0x26e984);
  QList<QString>::QList((QList<QString> *)0x26e992);
  QString::QString((QString *)0x26e9a0);
  *(undefined4 *)&in_RDI[0x10]._vptr_VCToolBase = 0xffffffff;
  QList<QString>::QList((QList<QString> *)0x26e9bb);
  *(undefined4 *)&in_RDI[0x14]._vptr_VCToolBase = 0;
  QString::QString((QString *)0x26e9d6);
  QList<QString>::QList((QList<QString> *)0x26e9e7);
  QString::QString((QString *)0x26e9f8);
  *(undefined4 *)&in_RDI[0x1e]._vptr_VCToolBase = 0xffffffff;
  *(undefined4 *)((long)&in_RDI[0x1e]._vptr_VCToolBase + 4) = 0;
  *(undefined4 *)&in_RDI[0x1f]._vptr_VCToolBase = 0xffffffff;
  in_RDI[0x20]._vptr_VCToolBase = (_func_int **)0xffffffffffffffff;
  in_RDI[0x21]._vptr_VCToolBase = (_func_int **)0xffffffffffffffff;
  *(undefined4 *)&in_RDI[0x22]._vptr_VCToolBase = 0xffffffff;
  QList<QString>::QList((QList<QString> *)0x26ea47);
  *(undefined4 *)&in_RDI[0x26]._vptr_VCToolBase = 0xffffffff;
  *(undefined4 *)((long)&in_RDI[0x26]._vptr_VCToolBase + 4) = 1;
  *(undefined4 *)&in_RDI[0x27]._vptr_VCToolBase = 0xffffffff;
  QString::QString((QString *)0x26ea76);
  *(undefined4 *)&in_RDI[0x2b]._vptr_VCToolBase = 0;
  *(undefined4 *)((long)&in_RDI[0x2b]._vptr_VCToolBase + 4) = 0xffffffff;
  *(undefined4 *)&in_RDI[0x2c]._vptr_VCToolBase = 0;
  *(undefined4 *)((long)&in_RDI[0x2c]._vptr_VCToolBase + 4) = 0;
  QString::QString((QString *)0x26eaaf);
  *(undefined4 *)&in_RDI[0x30]._vptr_VCToolBase = 0xffffffff;
  QString::QString((QString *)0x26eaca);
  *(undefined4 *)&in_RDI[0x34]._vptr_VCToolBase = 0xffffffff;
  QString::QString((QString *)0x26eae5);
  QString::QString((QString *)0x26eaf6);
  QString::QString((QString *)0x26eb07);
  QString::QString((QString *)0x26eb18);
  *(undefined4 *)&in_RDI[0x41]._vptr_VCToolBase = 0;
  *(undefined4 *)((long)&in_RDI[0x41]._vptr_VCToolBase + 4) = 0;
  QString::QString((QString *)0x26eb3d);
  QString::QString((QString *)0x26eb4e);
  *(undefined4 *)&in_RDI[0x48]._vptr_VCToolBase = 0xffffffff;
  *(undefined4 *)((long)&in_RDI[0x48]._vptr_VCToolBase + 4) = 0xffffffff;
  *(undefined4 *)&in_RDI[0x49]._vptr_VCToolBase = 0xffffffff;
  *(undefined4 *)((long)&in_RDI[0x49]._vptr_VCToolBase + 4) = 0xffffffff;
  *(undefined4 *)&in_RDI[0x4a]._vptr_VCToolBase = 0;
  in_RDI[0x4b]._vptr_VCToolBase = (_func_int **)0xffffffffffffffff;
  in_RDI[0x4c]._vptr_VCToolBase = (_func_int **)0xffffffffffffffff;
  QString::QString((QString *)0x26eba7);
  *(undefined4 *)&in_RDI[0x50]._vptr_VCToolBase = 0;
  *(undefined4 *)((long)&in_RDI[0x50]._vptr_VCToolBase + 4) = 0xffffffff;
  *(undefined4 *)&in_RDI[0x51]._vptr_VCToolBase = 0xffffffff;
  *(undefined4 *)((long)&in_RDI[0x51]._vptr_VCToolBase + 4) = 0xffffffff;
  *(undefined4 *)&in_RDI[0x52]._vptr_VCToolBase = 0xffffffff;
  *(undefined4 *)((long)&in_RDI[0x52]._vptr_VCToolBase + 4) = 0;
  *(undefined4 *)&in_RDI[0x53]._vptr_VCToolBase = 0;
  *(undefined4 *)((long)&in_RDI[0x53]._vptr_VCToolBase + 4) = 0xffffffff;
  *(undefined4 *)&in_RDI[0x54]._vptr_VCToolBase = 0xffffffff;
  QString::QString((QString *)0x26ec12);
  in_RDI[0x58]._vptr_VCToolBase = (_func_int **)0x0;
  QString::QString((QString *)0x26ec2e);
  *(undefined4 *)&in_RDI[0x5c]._vptr_VCToolBase = 0xffffffff;
  QList<QString>::QList((QList<QString> *)0x26ec49);
  QString::QString((QString *)0x26ec5a);
  *(undefined4 *)&in_RDI[99]._vptr_VCToolBase = 0xffffffff;
  QString::QString((QString *)0x26ec75);
  *(undefined4 *)&in_RDI[0x67]._vptr_VCToolBase = 0xffffffff;
  in_RDI[0x68]._vptr_VCToolBase = (_func_int **)0xffffffffffffffff;
  *(undefined4 *)&in_RDI[0x69]._vptr_VCToolBase = 0xffffffff;
  *(undefined4 *)((long)&in_RDI[0x69]._vptr_VCToolBase + 4) = 0xffffffff;
  *(undefined4 *)&in_RDI[0x6a]._vptr_VCToolBase = 0xffffffff;
  QList<QString>::QList((QList<QString> *)0x26ecb9);
  QString::QString((QString *)0x26ecca);
  QString::QString((QString *)0x26ecdb);
  QString::QString((QString *)0x26ecec);
  *(undefined4 *)&in_RDI[0x77]._vptr_VCToolBase = 0xffffffff;
  *(undefined4 *)((long)&in_RDI[0x77]._vptr_VCToolBase + 4) = 0xffffffff;
  QString::QString((QString *)0x26ed11);
  QString::QString((QString *)0x26ed22);
  QString::QString((QString *)0x26ed33);
  *(undefined4 *)&in_RDI[0x81]._vptr_VCToolBase = 0xffffffff;
  QString::QString((QString *)0x26ed4e);
  return;
}

Assistant:

VCLinkerTool::VCLinkerTool()
    :   DataExecutionPrevention(unset),
        EnableCOMDATFolding(optFoldingDefault),
        GenerateDebugInformation(unset),
        DebugInfoOption(linkerDebugOptionNone),
        GenerateMapFile(unset),
        HeapCommitSize(-1),
        HeapReserveSize(-1),
        IgnoreAllDefaultLibraries(unset),
        IgnoreEmbeddedIDL(unset),
        IgnoreImportLibrary(_True),
        ImageHasSafeExceptionHandlers(unset),
        LargeAddressAware(addrAwareDefault),
        LinkDLL(unset),
        LinkIncremental(linkIncrementalDefault),
        LinkTimeCodeGeneration(optLTCGDefault),
        MapExports(unset),
        MapLines(unset),
        OptimizeForWindows98(optWin98Default),
        OptimizeReferences(optReferencesDefault),
        RandomizedBaseAddress(unset),
        RegisterOutput(unset),
        ResourceOnlyDLL(unset),
        SetChecksum(unset),
        ShowProgress(linkProgressNotSet),
        StackCommitSize(-1),
        StackReserveSize(-1),
        SubSystem(subSystemNotSet),
        SupportUnloadOfDelayLoadedDLL(unset),
        SuppressStartupBanner(unset),
        SwapRunFromCD(unset),
        SwapRunFromNet(unset),
        TargetMachine(machineNotSet),
        TerminalServerAware(termSvrAwareDefault),
        TreatWarningsAsErrors(unset),
        TurnOffAssemblyGeneration(unset),
        TypeLibraryResourceID(0),
        GenerateManifest(unset),
        EnableUAC(unset),
        UACUIAccess(unset),
        SectionAlignment(-1),
        PreventDllBinding(unset),
        AllowIsolation(unset),
        AssemblyDebug(unset),
        CLRUnmanagedCodeCheck(unset),
        DelaySign(unset),
        GenerateWindowsMetadata(unset)
{
}